

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O0

void init_pixmaps(void)

{
  ushort uVar1;
  ushort uVar2;
  Am_Object AVar3;
  Am_Method_Wrapper *pAVar4;
  Am_Object *pAVar5;
  Am_Constraint *pAVar6;
  ulong uVar7;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28 [3];
  Am_Object local_10;
  
  get_icon((char *)&local_10,"images/horse.gif");
  Am_Object::operator=(&horse,&local_10);
  Am_Object::~Am_Object(&local_10);
  get_icon((char *)local_28,"images/girl.gif");
  Am_Object::operator=(&girl,local_28);
  Am_Object::~Am_Object(local_28);
  get_icon((char *)&local_30,"images/dog.gif");
  Am_Object::operator=(&dog,&local_30);
  Am_Object::~Am_Object(&local_30);
  get_icon((char *)&local_38,"images/bugsmall.gif");
  Am_Object::operator=(&bug,&local_38);
  Am_Object::~Am_Object(&local_38);
  uVar1 = Am_Object::Set(0x25b8,100,500);
  AVar3.data = (Am_Object_Data *)Am_Object::Set(uVar1,0x65,0x32);
  Am_Object::Create((char *)&local_40);
  Am_Object::Add_Part(AVar3,SUB81(&local_40,0),1);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Create((char *)&local_48);
  uVar1 = Am_Object::Set((ushort)&local_48,true,0);
  pAVar4 = Am_Timing_Function::operator_cast_to_Am_Method_Wrapper_
                     ((Am_Timing_Function *)&Am_Slow_In_Slow_Out);
  uVar1 = Am_Object::Set(uVar1,(Am_Method_Wrapper *)0x102,(ulong)pAVar4);
  uVar1 = Am_Object::Add(uVar1,0x105,3);
  pAVar5 = (Am_Object *)Am_Object::Add(uVar1,0x106,3);
  Am_Object::operator=(&doganimation,pAVar5);
  Am_Object::~Am_Object(&local_48);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)same_as_horse_bottom);
  uVar1 = Am_Object::Set(0x25c8,(Am_Constraint *)0x65,(ulong)pAVar6);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)behind_horse);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x64,(ulong)pAVar6);
  uVar7 = Am_Animate_With(&doganimation);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x64,uVar7);
  uVar7 = Am_Animate_With(&doganimation);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x65,uVar7);
  Am_Object::Create((char *)&local_50);
  uVar2 = Am_Object::Set((ushort)&local_50,100,0xfffffc18);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x65,0xfffffc18);
  pAVar5 = (Am_Object *)Am_Object::operator=(&dogvisibleanimation,pAVar5);
  uVar7 = Am_Animate_With(pAVar5);
  Am_Object::Set(uVar1,(Am_Constraint *)0x69,uVar7);
  Am_Object::~Am_Object(&local_50);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)left_on_horse);
  uVar1 = Am_Object::Set(0x25c0,(Am_Constraint *)0x64,(ulong)pAVar6);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)top_on_horse);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x65,(ulong)pAVar6);
  Am_Object::Set(uVar1,true,0);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)left_on_dog);
  uVar1 = Am_Object::Set(0x25d0,(Am_Constraint *)0x64,(ulong)pAVar6);
  pAVar6 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)top_on_dog);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x65,(ulong)pAVar6);
  Am_Object::Set(uVar1,true,0);
  Am_Object::Am_Object(&local_58,&horse);
  AVar3.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x1124c8,SUB81(&local_58,0),1);
  Am_Object::Am_Object(&local_60,&girl);
  AVar3.data = (Am_Object_Data *)Am_Object::Add_Part(AVar3,SUB81(&local_60,0),1);
  Am_Object::Am_Object(&local_68,&dog);
  AVar3.data = (Am_Object_Data *)Am_Object::Add_Part(AVar3,SUB81(&local_68,0),1);
  Am_Object::Am_Object(&local_70,&bug);
  Am_Object::Add_Part(AVar3,SUB81(&local_70,0),1);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  return;
}

Assistant:

static void
init_pixmaps()
{
  horse = get_icon("images/horse.gif", "horse");
  girl = get_icon("images/girl.gif", "girl");
  dog = get_icon("images/dog.gif", "dog");
  bug = get_icon("images/bugsmall.gif", "bug");

  horse.Set(Am_LEFT, 500)
      .Set(Am_TOP, 50)
      .Add_Part(Am_Move_Grow_Interactor.Create("Move_Horse"));

  doganimation = Am_Animator.Create("dog_position")
                     .Set(Am_ACTIVE, false)
                     .Set(Am_TIMING_FUNCTION, Am_Slow_In_Slow_Out)
                     .Add(Am_SHARPNESS_1, 3)
                     .Add(Am_SHARPNESS_2, 3);
  dog.Set(Am_TOP, same_as_horse_bottom)
      .Set(Am_LEFT, behind_horse)
      .Set(Am_LEFT, Am_Animate_With(doganimation))
      .Set(Am_TOP, Am_Animate_With(doganimation))
      .Set(Am_VISIBLE,
           Am_Animate_With(dogvisibleanimation =
                               Am_Visible_Animator.Create("dog_visible")
                                   .Set(Am_LEFT, -1000)
                                   .Set(Am_TOP, -1000)));
  girl.Set(Am_LEFT, left_on_horse)
      .Set(Am_TOP, top_on_horse)
      .Set(Am_VISIBLE, false);
  bug.Set(Am_LEFT, left_on_dog).Set(Am_TOP, top_on_dog).Set(Am_VISIBLE, false);

  fade_group.Add_Part(horse).Add_Part(girl).Add_Part(dog).Add_Part(bug);
}